

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O0

void __thiscall chrono::copter::Copter<6>::ControlIncremental(Copter<6> *this,double *inputs)

{
  __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  double dVar1;
  int local_1c;
  int i;
  double *inputs_local;
  Copter<6> *this_local;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    dVar1 = ChClamp<double>(this->u_p[local_1c] + inputs[local_1c],-1.0,1.0);
    this->u_p[local_1c] = dVar1;
    this_00 = (__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
                 ::operator[](&this->speeds,(long)local_1c);
    this_01 = std::
              __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    ChFunction_Const::Set_yconst(this_01,this->u_p[local_1c] * this->rps_max * 6.283185307179586);
  }
  return;
}

Assistant:

void Copter<nop>::ControlIncremental(double inputs[nop]) {
    for (int i = 0; i < nop; i++) {
        u_p[i] = ChClamp(u_p[i] + inputs[i], -1.0, 1.0);
        speeds[i]->Set_yconst(u_p[i] * rps_max * CH_C_2PI);
    }
}